

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

Vec_Int_t * Mop_ManCollectStats(Mop_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Wrd_t *pVVar6;
  word *pwVar7;
  Vec_Int_t *pVVar8;
  int *__s;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  
  iVar1 = p->nWordsIn;
  uVar10 = iVar1 * 0x20;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nSize = 0;
  pVVar8->nCap = uVar10;
  if (iVar1 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar10 * 4);
  }
  pVVar8->pArray = __s;
  pVVar8->nSize = uVar10;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)(int)uVar10 << 2);
  }
  pVVar4 = p->vCubes;
  if (0 < pVVar4->nSize) {
    piVar5 = pVVar4->pArray;
    pVVar6 = p->vWordsIn;
    uVar13 = 1;
    if (1 < (int)uVar10) {
      uVar13 = (ulong)uVar10;
    }
    iVar2 = p->nWordsIn;
    lVar15 = 0;
    do {
      uVar10 = iVar2 * piVar5[lVar15];
      if (((int)uVar10 < 0) || (pVVar6->nSize <= (int)uVar10)) {
LAB_00333277:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar3 = p->nWordsOut;
      uVar11 = piVar5[lVar15] * uVar3;
      if (((int)uVar11 < 0) || (p->vWordsOut->nSize <= (int)uVar11)) goto LAB_00333277;
      if ((int)uVar3 < 1) {
        iVar16 = 0;
      }
      else {
        uVar12 = 0;
        iVar16 = 0;
        do {
          uVar9 = p->vWordsOut->pArray[uVar11 + uVar12];
          uVar9 = uVar9 - (uVar9 >> 1 & 0x5555555555555555);
          uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
          uVar9 = (uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f;
          uVar9 = (uVar9 >> 8) + uVar9;
          lVar14 = (uVar9 >> 0x10) + uVar9;
          iVar16 = iVar16 + ((int)((ulong)lVar14 >> 0x20) + (int)lVar14 & 0xffU);
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
      }
      if (0 < iVar1) {
        pwVar7 = pVVar6->pArray;
        uVar12 = 0;
        do {
          if ((pwVar7[(ulong)uVar10 + (uVar12 >> 5 & 0x7ffffff)] >> ((char)uVar12 * '\x02' & 0x3fU)
              & 3) != 0) {
            __s[uVar12] = __s[uVar12] + iVar16;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar13);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar4->nSize);
  }
  return pVVar8;
}

Assistant:

Vec_Int_t * Mop_ManCollectStats( Mop_Man_t * p )
{
    int i, v, iCube, nVars = 32 * p->nWordsIn;
    Vec_Int_t * vStats = Vec_IntStart( nVars );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
    {
        word * pCube = Mop_ManCubeIn(p, iCube);
        int nOutLits = Mop_ManCountOnes( Mop_ManCubeOut(p, iCube), p->nWordsOut );
        for ( v = 0; v < nVars; v++ )
            if ( Abc_TtGetQua(pCube, v) )
                Vec_IntAddToEntry( vStats, v, nOutLits );
    }
    return vStats;
}